

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int update_1rtt_key(quicly_conn_t *conn,ptls_cipher_suite_t *cipher,int is_enc,
                   ptls_aead_context_t **aead,uint8_t *secret)

{
  size_t outlen;
  ptls_aead_context_t *ctx;
  ptls_aead_context_t **pppVar1;
  int iVar2;
  quicly_crypto_engine_t *pqVar3;
  ptls_iovec_t secret_00;
  ptls_aead_context_t *new_aead;
  uint8_t new_secret [64];
  ptls_aead_context_t *local_98;
  ptls_aead_context_t **local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [72];
  
  local_98 = (ptls_aead_context_t *)0x0;
  outlen = cipher->hash->digest_size;
  local_88 = 0;
  uStack_80 = 0;
  secret_00.len = outlen;
  secret_00.base = secret;
  local_90 = aead;
  iVar2 = ptls_hkdf_expand_label
                    (cipher->hash,local_78,outlen,secret_00,"quic ku",(ptls_iovec_t)ZEXT816(0),
                     (char *)0x0);
  pppVar1 = local_90;
  if (iVar2 == 0) {
    if (conn == (quicly_conn_t *)0x0) {
      pqVar3 = &quicly_default_crypto_engine;
    }
    else {
      pqVar3 = ((conn->super).ctx)->crypto_engine;
    }
    iVar2 = (*pqVar3->setup_cipher)
                      (pqVar3,conn,3,is_enc,(ptls_cipher_context_t **)0x0,&local_98,cipher->aead,
                       cipher->hash,local_78);
    if (iVar2 == 0) {
      ctx = *pppVar1;
      if (ctx != (ptls_aead_context_t *)0x0) {
        ptls_aead_free(ctx);
      }
      *pppVar1 = local_98;
      local_98 = (ptls_aead_context_t *)0x0;
      memcpy(secret,local_78,cipher->hash->digest_size);
      iVar2 = 0;
    }
    else if (local_98 != (ptls_aead_context_t *)0x0) {
      ptls_aead_free(local_98);
    }
  }
  (*ptls_clear_memory)(local_78,cipher->hash->digest_size);
  return iVar2;
}

Assistant:

static int update_1rtt_key(quicly_conn_t *conn, ptls_cipher_suite_t *cipher, int is_enc, ptls_aead_context_t **aead,
                           uint8_t *secret)
{
    uint8_t new_secret[PTLS_MAX_DIGEST_SIZE];
    ptls_aead_context_t *new_aead = NULL;
    int ret;

    /* generate next AEAD key */
    if ((ret = ptls_hkdf_expand_label(cipher->hash, new_secret, cipher->hash->digest_size,
                                      ptls_iovec_init(secret, cipher->hash->digest_size), "quic ku", ptls_iovec_init(NULL, 0),
                                      NULL)) != 0)
        goto Exit;
    if ((ret = setup_cipher(conn, QUICLY_EPOCH_1RTT, is_enc, NULL, &new_aead, cipher->aead, cipher->hash, new_secret)) != 0)
        goto Exit;

    /* success! update AEAD and secret */
    if (*aead != NULL)
        ptls_aead_free(*aead);
    *aead = new_aead;
    new_aead = NULL;
    memcpy(secret, new_secret, cipher->hash->digest_size);

    ret = 0;
Exit:
    if (new_aead != NULL)
        ptls_aead_free(new_aead);
    ptls_clear_memory(new_secret, cipher->hash->digest_size);
    return ret;
}